

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
MapEntry<int,_double,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)1>
::~MapEntry(MapEntry<int,_double,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)1>
            *this)

{
  Arena *pAVar1;
  MapEntry<int,_double,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)1>
  *this_local;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__MapEntry_02a31dd8;
  pAVar1 = protobuf::MessageLite::GetArena((MessageLite *)this);
  if (pAVar1 == (Arena *)0x0) {
    SharedDtor((MessageLite *)this);
  }
  Message::~Message(&this->super_Message);
  return;
}

Assistant:

~MapEntry() PROTOBUF_OVERRIDE {
    // Make sure that `Value` is never a derived message type.
    // We don't want to instantiate the template with every unique derived type.
    // The assertion is in the destructor because we need `Value` to be
    // complete to test it.
    static_assert(!std::is_base_of<Message, Value>::value ||
                      std::is_same<Message, Value>::value,
                  "");

    if (GetArena() != nullptr) return;
    SharedDtor(*this);
  }